

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDate.cpp
# Opt level: O3

void __thiscall
PDFDate::SetTime(PDFDate *this,int inYear,int inMonth,int inDay,int inHour,int inMinute,int inSecond
                ,EUTCRelation inUTC,int inHourFromUTC,int inMinuteFromUTC)

{
  int in_stack_00000008;
  
  this->Year = inYear;
  this->Month = inMonth;
  this->Day = inDay;
  this->Hour = inHour;
  this->Minute = inMinute;
  this->Second = in_stack_00000008;
  this->UTC = inSecond;
  this->HourFromUTC = inUTC;
  this->MinuteFromUTC = inHourFromUTC;
  return;
}

Assistant:

void PDFDate::SetTime(	int inYear,
						int inMonth,
						int inDay,
						int inHour,
						int inMinute,
						int inSecond,
						EUTCRelation inUTC,
						int inHourFromUTC,
						int inMinuteFromUTC)
{
	Year = inYear;
	Month = inMonth;
	Day = inDay;
	Hour = inHour;
	Minute = inMinute;
	Second = inSecond;
	UTC = inUTC;
	HourFromUTC = inHourFromUTC;
	MinuteFromUTC = inMinuteFromUTC;
}